

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestGroupUtil.hpp
# Opt level: O1

void vkt::addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
               (TestCaseGroup *parent,string *name,string *description,
               CreateChildrenFunc createChildren,GroupParameters arg0)

{
  TestContext *testCtx;
  TestNode *node;
  
  testCtx = (parent->super_TestNode).m_testCtx;
  node = (TestNode *)operator_new(0x88);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p)
  ;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2d4e8;
  node[1]._vptr_TestNode = (_func_int **)wsi::anon_unknown_0::populateSwapchainGroup;
  *(int *)&node[1].m_testCtx = (int)createChildren;
  node[1].m_name._M_dataplus._M_p = arg0._0_8_;
  tcu::TestNode::addChild(&parent->super_TestNode,node);
  return;
}

Assistant:

void addTestGroup (tcu::TestCaseGroup*									parent,
				   const std::string&									name,
				   const std::string&									description,
				   typename TestGroupHelper1<Arg0>::CreateChildrenFunc	createChildren,
				   Arg0													arg0)
{
	parent->addChild(createTestGroup<Arg0>(parent->getTestContext(), name, description, createChildren, arg0));
}